

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

int nn_trie_subscribe(nn_trie *self,uint8_t *data,size_t size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int index;
  byte *pbVar6;
  nn_trie_node *pnVar7;
  nn_trie_node **ppnVar8;
  nn_trie_node **__src;
  nn_trie_node *pnVar9;
  uint8_t *puVar10;
  long lVar11;
  uint8_t local_94;
  uint local_88;
  uint local_84;
  uint local_70;
  uint local_6c;
  int more_nodes;
  int inserted;
  int new_children;
  int old_children;
  uint8_t new_max;
  uint8_t new_min;
  uint8_t c2;
  uint8_t c;
  int pos;
  nn_trie_node *old_node;
  nn_trie_node *ch;
  nn_trie_node **n;
  nn_trie_node **node;
  size_t sStack_20;
  int i;
  size_t size_local;
  uint8_t *data_local;
  nn_trie *self_local;
  
  n = &self->root;
  sStack_20 = size;
  size_local = (size_t)data;
  do {
    if (*n == (nn_trie_node *)0x0) {
LAB_00124cca:
      if (*n != (nn_trie_node *)0x0) {
        __assert_fail("!*node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x197,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
      }
      while( true ) {
        bVar4 = 10 < sStack_20;
        lVar11 = 0;
        if (bVar4) {
          lVar11 = 8;
        }
        pnVar9 = (nn_trie_node *)nn_alloc_(lVar11 + 0x18);
        *n = pnVar9;
        if (*n == (nn_trie_node *)0x0) {
          __assert_fail("*node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                        ,0x19e,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
        }
        (*n)->refcount = 0;
        (*n)->type = bVar4;
        if (sStack_20 < 10) {
          local_94 = (uint8_t)sStack_20;
        }
        else {
          local_94 = '\n';
        }
        (*n)->prefix_len = local_94;
        memcpy((*n)->prefix,(void *)size_local,(ulong)(*n)->prefix_len);
        puVar10 = (uint8_t *)(size_local + (long)(int)(uint)(*n)->prefix_len);
        bVar3 = (*n)->prefix_len;
        if (!bVar4) break;
        ((*n)->u).sparse.children[0] = *puVar10;
        n = nn_node_child(*n,0);
        size_local = (size_t)(puVar10 + 1);
        sStack_20 = (sStack_20 - bVar3) - 1;
      }
LAB_00124e51:
      (*n)->refcount = (*n)->refcount + 1;
      return (uint)((*n)->refcount == 1);
    }
    iVar5 = nn_node_check_prefix(*n,(uint8_t *)size_local,sStack_20);
    pbVar6 = (byte *)(size_local + (long)iVar5);
    lVar11 = sStack_20 - (long)iVar5;
    if (iVar5 < (int)(uint)(*n)->prefix_len) {
      pnVar9 = *n;
      pnVar7 = (nn_trie_node *)nn_alloc_(0x20);
      *n = pnVar7;
      if (*n == (nn_trie_node *)0x0) {
        __assert_fail("*node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x124,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
      }
      (*n)->refcount = 0;
      (*n)->prefix_len = (uint8_t)iVar5;
      (*n)->type = '\x01';
      memcpy((*n)->prefix,pnVar9->prefix,(long)iVar5);
      ((*n)->u).sparse.children[0] = pnVar9->prefix[iVar5];
      pnVar9->prefix_len = pnVar9->prefix_len - ((uint8_t)iVar5 + '\x01');
      memmove(pnVar9->prefix,pnVar9->prefix + (long)iVar5 + 1,(ulong)pnVar9->prefix_len);
      pnVar9 = nn_node_compact(pnVar9);
      ppnVar8 = nn_node_child(*n,0);
      *ppnVar8 = pnVar9;
LAB_00124736:
      if (lVar11 == 0) goto LAB_00124e51;
      if ((*n)->type < 8) {
        pnVar9 = (nn_trie_node *)nn_realloc(*n,(long)(int)((*n)->type + 1) * 8 + 0x18);
        *n = pnVar9;
        if (*n == (nn_trie_node *)0x0) {
          __assert_fail("*node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                        ,0x13c,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
        }
        (*n)->prefix[(ulong)(*n)->type + 10] = *pbVar6;
        (*n)->type = (*n)->type + '\x01';
        n = nn_node_child(*n,(*n)->type - 1);
        *n = (nn_trie_node *)0x0;
        size_local = (size_t)(pbVar6 + 1);
        sStack_20 = lVar11 - 1;
      }
      else if ((*n)->type == '\t') {
        bVar3 = *pbVar6;
        if ((bVar3 < ((*n)->u).sparse.children[0]) || (((*n)->u).sparse.children[1] < bVar3)) {
          bVar1 = bVar3;
          if (((*n)->u).sparse.children[0] < bVar3) {
            bVar1 = ((*n)->u).sparse.children[0];
          }
          local_6c = (uint)bVar1;
          bVar2 = bVar3;
          if (bVar3 < ((*n)->u).sparse.children[1]) {
            bVar2 = ((*n)->u).sparse.children[1];
          }
          local_70 = (uint)bVar2;
          pnVar9 = (nn_trie_node *)nn_realloc(*n,(long)(int)((local_70 - local_6c) + 1) * 8 + 0x18);
          *n = pnVar9;
          if (*n == (nn_trie_node *)0x0) {
            __assert_fail("*node",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                          ,0x14f,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)")
            ;
          }
          iVar5 = ((uint)((*n)->u).sparse.children[1] - (uint)((*n)->u).sparse.children[0]) + 1;
          if (((*n)->u).sparse.children[0] == bVar1) {
            ppnVar8 = nn_node_child(*n,iVar5);
            memset(ppnVar8,0,(long)(int)(((local_70 - local_6c) + 1) - iVar5) << 3);
          }
          else {
            index = ((*n)->u).sparse.children[0] - local_6c;
            ppnVar8 = nn_node_child(*n,index);
            __src = nn_node_child(*n,0);
            memmove(ppnVar8,__src,(long)iVar5 << 3);
            ppnVar8 = nn_node_child(*n,0);
            memset(ppnVar8,0,(long)index << 3);
          }
          ((*n)->u).sparse.children[0] = bVar1;
          ((*n)->u).sparse.children[1] = bVar2;
        }
        ((*n)->u).dense.nbr = ((*n)->u).dense.nbr + 1;
        n = nn_node_child(*n,(uint)bVar3 - (uint)((*n)->u).sparse.children[0]);
        size_local = (size_t)(pbVar6 + 1);
        sStack_20 = lVar11 - 1;
      }
      else {
        new_children._1_1_ = 0xff;
        new_children._0_1_ = 0;
        for (node._4_4_ = 0; node._4_4_ != (*n)->type; node._4_4_ = node._4_4_ + 1) {
          bVar3 = (*n)->prefix[(long)(int)node._4_4_ + 10];
          bVar1 = bVar3;
          if (new_children._1_1_ < bVar3) {
            bVar1 = new_children._1_1_;
          }
          new_children._1_1_ = bVar1;
          if (bVar3 < (byte)new_children) {
            bVar3 = (byte)new_children;
          }
          new_children._0_1_ = bVar3;
        }
        if (*pbVar6 <= new_children._1_1_) {
          new_children._1_1_ = *pbVar6;
        }
        local_84 = (uint)new_children._1_1_;
        if ((byte)new_children <= *pbVar6) {
          new_children._0_1_ = *pbVar6;
        }
        local_88 = (uint)(byte)new_children;
        pnVar9 = *n;
        pnVar7 = (nn_trie_node *)nn_alloc_((long)(int)((local_88 - local_84) + 1) * 8 + 0x18);
        *n = pnVar7;
        if (*n == (nn_trie_node *)0x0) {
          __assert_fail("*node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                        ,0x17d,"int nn_trie_subscribe(struct nn_trie *, const uint8_t *, size_t)");
        }
        (*n)->refcount = 0;
        (*n)->prefix_len = pnVar9->prefix_len;
        (*n)->type = '\t';
        memcpy((*n)->prefix,pnVar9->prefix,(ulong)pnVar9->prefix_len);
        ((*n)->u).sparse.children[0] = new_children._1_1_;
        ((*n)->u).sparse.children[1] = (byte)new_children;
        ((*n)->u).dense.nbr = pnVar9->type + 1;
        memset(*n + 1,0,(long)(int)((local_88 - local_84) + 1) << 3);
        for (node._4_4_ = 0; node._4_4_ != pnVar9->type; node._4_4_ = node._4_4_ + 1) {
          ppnVar8 = nn_node_child(pnVar9,node._4_4_);
          pnVar7 = *ppnVar8;
          ppnVar8 = nn_node_child(*n,pnVar9->prefix[(long)(int)node._4_4_ + 10] - local_84);
          *ppnVar8 = pnVar7;
        }
        n = nn_node_next(*n,*pbVar6);
        size_local = (size_t)(pbVar6 + 1);
        sStack_20 = lVar11 - 1;
        nn_free(pnVar9);
      }
      goto LAB_00124cca;
    }
    if (lVar11 == 0) goto LAB_00124e51;
    ppnVar8 = nn_node_next(*n,*pbVar6);
    if ((ppnVar8 == (nn_trie_node **)0x0) || (*ppnVar8 == (nn_trie_node *)0x0)) goto LAB_00124736;
    size_local = (size_t)(pbVar6 + 1);
    sStack_20 = lVar11 - 1;
    n = ppnVar8;
  } while( true );
}

Assistant:

int nn_trie_subscribe (struct nn_trie *self, const uint8_t *data, size_t size)
{
    int i;
    struct nn_trie_node **node;
    struct nn_trie_node **n;
    struct nn_trie_node *ch;
    struct nn_trie_node *old_node;
    int pos;
    uint8_t c;
    uint8_t c2;
    uint8_t new_min;
    uint8_t new_max;
    int old_children;
    int new_children;
    int inserted;
    int more_nodes;

    /*  Step 1 -- Traverse the trie. */

    node = &self->root;
    pos = 0;
    while (1) {

        /*  If there are no more nodes on the path, go to step 4. */
        if (!*node)
            goto step4;

        /*  Check whether prefix matches the new subscription. */
        pos = nn_node_check_prefix (*node, data, size);
        data += pos;
        size -= pos;

        /*  If only part of the prefix matches, go to step 2. */
        if (pos < (*node)->prefix_len)
            goto step2;

        /*  Even if whole prefix matches and there's no more data to match,
            go directly to step 5. */
        if (!size)
            goto step5;

        /*  Move to the next node. If it is not present, go to step 3. */
        n = nn_node_next (*node, *data);
        if (!n || !*n)
            goto step3;
        node = n;
        ++data;
        --size;
    }

    /*  Step 2 -- Split the prefix into two parts if required. */
step2:

    ch = *node;
    *node = nn_alloc (sizeof (struct nn_trie_node) +
        sizeof (struct nn_trie_node*), "trie node");
    assert (*node);
    (*node)->refcount = 0;
    (*node)->prefix_len = pos;
    (*node)->type = 1;
    memcpy ((*node)->prefix, ch->prefix, pos);
    (*node)->u.sparse.children [0] = ch->prefix [pos];
    ch->prefix_len -= (pos + 1);
    memmove (ch->prefix, ch->prefix + pos + 1, ch->prefix_len);
    ch = nn_node_compact (ch);
    *nn_node_child (*node, 0) = ch;
    pos = (*node)->prefix_len;

    /*  Step 3 -- Adjust the child array to accommodate the new character. */
step3:

    /*  If there are no more data in the subscription, there's nothing to
        adjust in the child array. Proceed directly to the step 5. */
    if (!size)
        goto step5;

    /*  If the new branch fits into sparse array... */
    if ((*node)->type < NN_TRIE_SPARSE_MAX) {
        *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
            ((*node)->type + 1) * sizeof (struct nn_trie_node*));
        assert (*node);
        (*node)->u.sparse.children [(*node)->type] = *data;
        ++(*node)->type;
        node = nn_node_child (*node, (*node)->type - 1);
        *node = NULL;
        ++data;
        --size;
        goto step4;
    }

    /*  If the node is already a dense array, resize it to fit the next
        character. */
    if ((*node)->type == NN_TRIE_DENSE_TYPE) {
        c = *data;
        if (c < (*node)->u.dense.min || c > (*node)->u.dense.max) {
            new_min = (*node)->u.dense.min < c ? (*node)->u.dense.min : c;
            new_max = (*node)->u.dense.max > c ? (*node)->u.dense.max : c;
            *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
                (new_max - new_min + 1) * sizeof (struct nn_trie_node*));
            assert (*node);
            old_children = (*node)->u.dense.max - (*node)->u.dense.min + 1;
            new_children = new_max - new_min + 1;
            if ((*node)->u.dense.min != new_min) {
                inserted = (*node)->u.dense.min - new_min;
                memmove (nn_node_child (*node, inserted),
                    nn_node_child (*node, 0),
                    old_children * sizeof (struct nn_trie_node*));
                memset (nn_node_child (*node, 0), 0,
                    inserted * sizeof (struct nn_trie_node*));
            }
            else {
                memset (nn_node_child (*node, old_children), 0,
                    (new_children - old_children) *
                    sizeof (struct nn_trie_node*));
            }
            (*node)->u.dense.min = new_min;
            (*node)->u.dense.max = new_max;
        }
        ++(*node)->u.dense.nbr;

        node = nn_node_child (*node, c - (*node)->u.dense.min);
        ++data;
        --size;
        goto step4;
    }

    /*  This is a sparse array, but no more children can be added to it.
        We have to convert it into a dense array. */
    {
        /*  First, determine the range of children. */
        new_min = 255;
        new_max = 0;
        for (i = 0; i != (*node)->type; ++i) {
            c2 = (*node)->u.sparse.children [i];
            new_min = new_min < c2 ? new_min : c2;
            new_max = new_max > c2 ? new_max : c2;
        }
        new_min = new_min < *data ? new_min : *data;
        new_max = new_max > *data ? new_max : *data;

        /*  Create a new mode, while keeping the old one for a while. */
        old_node = *node;
        *node = (struct nn_trie_node*) nn_alloc (sizeof (struct nn_trie_node) +
            (new_max - new_min + 1) * sizeof (struct nn_trie_node*),
            "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->prefix_len = old_node->prefix_len;
        (*node)->type = NN_TRIE_DENSE_TYPE;
        memcpy ((*node)->prefix, old_node->prefix, old_node->prefix_len);
        (*node)->u.dense.min = new_min;
        (*node)->u.dense.max = new_max;
        (*node)->u.dense.nbr = old_node->type + 1;
        memset (*node + 1, 0, (new_max - new_min + 1) *
            sizeof (struct nn_trie_node*));
        for (i = 0; i != old_node->type; ++i)
            *nn_node_child (*node, old_node->u.sparse.children [i] - new_min) =
                *nn_node_child (old_node, i);
        node = nn_node_next (*node, *data);
        ++data;
        --size;

        /*  Get rid of the obsolete old node. */
        nn_free (old_node);
    }

    /*  Step 4 -- Create new nodes for remaining part of the subscription. */
step4:

    assert (!*node);
    while (1) {

        /*  Create a new node to hold the next part of the subscription. */
        more_nodes = size > NN_TRIE_PREFIX_MAX;
        *node = nn_alloc (sizeof (struct nn_trie_node) +
            (more_nodes ? sizeof (struct nn_trie_node*) : 0), "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->type = more_nodes ? 1 : 0;
        (*node)->prefix_len = size < (uint8_t) NN_TRIE_PREFIX_MAX ?
            (uint8_t) size : (uint8_t) NN_TRIE_PREFIX_MAX;
        memcpy ((*node)->prefix, data, (*node)->prefix_len);
        data += (*node)->prefix_len;
        size -= (*node)->prefix_len;
        if (!more_nodes)
            break;
        (*node)->u.sparse.children [0] = *data;
        node = nn_node_child (*node, 0);
        ++data;
        --size;
    }

    /*  Step 5 -- Create the subscription as such. */
step5:

    ++(*node)->refcount;

    /*  Return 1 in case of a fresh subscription. */
    return (*node)->refcount == 1 ? 1 : 0;
}